

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O3

Own<kj::File,_std::nullptr_t> __thiscall kj::newDiskFile(kj *this,OwnFd *fd)

{
  undefined8 *puVar1;
  File *extraout_RDX;
  Own<kj::File,_std::nullptr_t> OVar2;
  
  puVar1 = (undefined8 *)operator_new(0x10);
  *(int *)(puVar1 + 1) = fd->fd;
  fd->fd = -1;
  *puVar1 = &PTR_getFd_00627468;
  *(undefined8 **)this = &_::HeapDisposer<kj::(anonymous_namespace)::DiskFile>::instance;
  *(undefined8 **)(this + 8) = puVar1;
  OVar2.ptr = extraout_RDX;
  OVar2.disposer = (Disposer *)this;
  return OVar2;
}

Assistant:

Own<File> newDiskFile(kj::OwnFd fd) {
  return heap<DiskFile>(kj::mv(fd));
}